

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixMainParameters.cpp
# Opt level: O3

void fixMainParameters(Module *module,Program *program)

{
  Module *pMVar1;
  Value *pVVar2;
  Type *type;
  Func *pFVar3;
  pointer ppVVar4;
  pointer ppVVar5;
  Module *f;
  undefined1 auVar6 [16];
  long *local_58 [2];
  long local_48 [2];
  Type *local_38;
  
  type = TypeHandler::pointerTo
                   (&program->typeHandler,
                    (Type *)(program->typeHandler).schar._M_t.
                            super___uniq_ptr_impl<CharType,_std::default_delete<CharType>_>._M_t.
                            super__Tuple_impl<0UL,_CharType_*,_std::default_delete<CharType>_>.
                            super__Head_base<0UL,_CharType_*,_false>._M_head_impl);
  local_38 = TypeHandler::pointerTo(&program->typeHandler,type);
  for (pMVar1 = *(Module **)(module + 0x20); pMVar1 != module + 0x18;
      pMVar1 = *(Module **)(pMVar1 + 8)) {
    f = pMVar1 + -0x38;
    if (pMVar1 == (Module *)0x0) {
      f = (Module *)0x0;
    }
    auVar6 = llvm::Value::getName();
    if ((auVar6._8_8_ == 4) && (*auVar6._0_8_ == 0x6e69616d)) {
      pFVar3 = Program::getFunction(program,(Function *)f);
      if (*(char *)(**(long **)(*(long *)((Function *)f + 0x18) + 0x10) + 8) == '\r') {
        pFVar3->returnType =
             (Type *)(program->typeHandler).sint._M_t.
                     super___uniq_ptr_impl<IntType,_std::default_delete<IntType>_>._M_t.
                     super__Tuple_impl<0UL,_IntType_*,_std::default_delete<IntType>_>.
                     super__Head_base<0UL,_IntType_*,_false>._M_head_impl;
      }
      ppVVar4 = (pFVar3->parameters).super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppVVar5 = (pFVar3->parameters).super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (ppVVar5 != ppVVar4) {
        (*((*ppVVar4)->super_ExprBase).super_Expr._vptr_Expr[5])
                  (*ppVVar4,(program->typeHandler).sint._M_t.
                            super___uniq_ptr_impl<IntType,_std::default_delete<IntType>_>._M_t.
                            super__Tuple_impl<0UL,_IntType_*,_std::default_delete<IntType>_>.
                            super__Head_base<0UL,_IntType_*,_false>._M_head_impl);
        pVVar2 = *(pFVar3->parameters).super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl
                  .super__Vector_impl_data._M_start;
        local_58[0] = local_48;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"argc","");
        std::__cxx11::string::_M_assign((string *)&pVVar2->valueName);
        if (local_58[0] != local_48) {
          operator_delete(local_58[0],local_48[0] + 1);
        }
        ppVVar4 = (pFVar3->parameters).super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl
                  .super__Vector_impl_data._M_start;
        ppVVar5 = (pFVar3->parameters).super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl
                  .super__Vector_impl_data._M_finish;
      }
      if (8 < (ulong)((long)ppVVar5 - (long)ppVVar4)) {
        (*(ppVVar4[1]->super_ExprBase).super_Expr._vptr_Expr[5])(ppVVar4[1],local_38);
        pVVar2 = (pFVar3->parameters).super__Vector_base<Value_*,_std::allocator<Value_*>_>._M_impl.
                 super__Vector_impl_data._M_start[1];
        local_58[0] = local_48;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"argv","");
        std::__cxx11::string::_M_assign((string *)&pVVar2->valueName);
        if (local_58[0] != local_48) {
          operator_delete(local_58[0],local_48[0] + 1);
        }
      }
    }
  }
  Program::addPass(program,FixMainParameters);
  return;
}

Assistant:

void fixMainParameters(const llvm::Module* module, Program& program) {
    assert(program.isPassCompleted(PassType::CreateFunctionParameters));

    auto* uchar_ptr_ptr = program.typeHandler.pointerTo(program.typeHandler.pointerTo(program.typeHandler.schar.get()));

    for (const llvm::Function& func : module->functions()) {
        if (func.getName() != "main") {
            continue;
        }

        auto* myFunc = program.getFunction(&func);

        if (func.getReturnType()->isIntegerTy())
            myFunc->returnType = program.typeHandler.sint.get();

        if (myFunc->parameters.size() >= 1) {
            myFunc->parameters[0]->setType(program.typeHandler.sint.get());
            myFunc->parameters[0]->setName("argc");
        }

        if (myFunc->parameters.size() >= 2) {
            myFunc->parameters[1]->setType(uchar_ptr_ptr);
            myFunc->parameters[1]->setName("argv");
        }

    }

    program.addPass(PassType::FixMainParameters);
}